

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Const *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  BinaryOp BVar5;
  Binary *curr_00;
  byte bVar6;
  Expression *pEVar7;
  Expression **local_330 [2];
  undefined1 local_320 [16];
  matched_t<wasm::Match::Internal::AnyKind<long>_> *local_310;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2e8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_2b8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_288;
  bool local_250;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_230;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_200;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1d0;
  undefined1 local_1c0 [16];
  matched_t<wasm::Match::Internal::AnyKind<long>_> *local_1b0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_188;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_158;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_128;
  char local_f0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_d0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_a0;
  Literal local_70;
  element_type *local_58;
  Expression *local_50;
  Const *cx;
  Const *cy;
  undefined8 local_38;
  
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xdef,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  pEVar7 = curr->left;
  if ((((pEVar7->_id == BinaryId) && (pEVar1 = curr->right, pEVar1->_id == BinaryId)) &&
      (*(int *)(pEVar7 + 1) != *(int *)(pEVar1 + 1))) &&
     ((bVar4 = ExpressionAnalyzer::equal
                         ((Expression *)pEVar7[1].type.id,(Expression *)pEVar1[1].type.id), bVar4 &&
      (bVar4 = ExpressionAnalyzer::equal(*(Expression **)(pEVar7 + 2),*(Expression **)(pEVar1 + 2)),
      bVar4)))) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)local_330,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,(Expression *)pEVar7[1].type.id);
    if ((local_250 != false) ||
       (bVar4 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_330), bVar4)) {
      bVar6 = 0;
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)&local_1d0.func,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,*(Expression **)(pEVar7 + 2));
      bVar4 = true;
      if (local_f0 == '\0') {
        bVar4 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&local_1d0.func);
      }
      bVar6 = bVar4 ^ 1;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_a0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_d0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_158);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_188);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)(local_1c0 + 8));
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_200);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_230);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_288);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_2b8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_2e8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(local_320 + 8));
    if (((bVar6 != 0) && (*(int *)(pEVar7 + 1) == 0xf)) && (*(int *)(pEVar1 + 1) == 0x15)) {
      *(undefined4 *)(pEVar7 + 1) = 0x17;
      return pEVar7;
    }
  }
  curr_00 = (Binary *)curr->left;
  local_320._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_310 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
       BinaryId) && (local_50 = curr_00->right, local_50->_id == ConstId)) {
    local_38 = curr_00->left;
    local_330[0] = &local_50;
    cy = (Const *)this;
    Literal::Literal((Literal *)&local_1d0.func,(Literal *)(local_50 + 1));
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                       *)local_320,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_1d0.func);
    Literal::~Literal((Literal *)&local_1d0.func);
    this = (OptimizeInstructions *)cy;
    if (!bVar4) goto LAB_009db871;
    pEVar7 = curr->right;
    local_1c0._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_1b0 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_1d0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&cx;
    if ((pEVar7->_id != BinaryId) ||
       (pCVar2 = *(Const **)(pEVar7 + 2),
       (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
       ) goto LAB_009db871;
    local_58 = (element_type *)pEVar7[1].type.id;
    cx = pCVar2;
    Literal::Literal(&local_70,&pCVar2->value);
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                       *)local_1c0,&local_70);
    Literal::~Literal(&local_70);
    this = (OptimizeInstructions *)cy;
    if (((!bVar4) ||
        (((curr_00->op != *(BinaryOp *)(pEVar7 + 1) ||
          ((((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed !=
           (local_58->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed)) ||
         (bVar4 = Literal::operator==((Literal *)(local_50 + 1),&cx->value), !bVar4)))) ||
       (bVar4 = inversesOr(this,curr_00), uVar3 = local_38, !bVar4)) goto LAB_009db871;
    BVar5 = Abstract::getBinary((Type)(((element_type *)local_38)->values).
                                      super_SmallVector<wasm::Literal,_1UL>.usedFixed,And);
    *(BinaryOp *)(pEVar7 + 1) = BVar5;
    (pEVar7->type).id =
         (((element_type *)uVar3)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    pEVar7[1].type.id = uVar3;
LAB_009db9cd:
    *(element_type **)(pEVar7 + 2) = local_58;
    curr_00->left = pEVar7;
  }
  else {
LAB_009db871:
    curr_00 = (Binary *)curr->left;
    local_320._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_310 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((curr_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) && (local_50 = curr_00->right, local_50->_id == ConstId)) {
      cy = (Const *)curr_00->left;
      local_330[0] = &local_50;
      Literal::Literal((Literal *)&local_1d0.func,(Literal *)(local_50 + 1));
      bVar4 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                         *)local_320,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_1d0.func);
      Literal::~Literal((Literal *)&local_1d0.func);
      if (bVar4) {
        pEVar7 = curr->right;
        local_1c0._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_1b0 = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_1d0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&cx;
        if ((pEVar7->_id == BinaryId) &&
           (cx = *(Const **)(pEVar7 + 2),
           (cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
           ) {
          local_38 = pEVar7[1].type.id;
          Literal::Literal(&local_70,&cx->value);
          bVar4 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                             *)local_1c0,&local_70);
          Literal::~Literal(&local_70);
          if ((bVar4) &&
             ((((curr_00->op == *(BinaryOp *)(pEVar7 + 1) &&
                ((cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id
                 == (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.
                    usedFixed)) &&
               (bVar4 = Literal::operator==((Literal *)(local_50 + 1),&cx->value), bVar4)) &&
              (bVar4 = preserveOr(this,curr_00), pCVar2 = cy, bVar4)))) {
            BVar5 = Abstract::getBinary((Type)(cy->
                                              super_SpecificExpression<(wasm::Expression::Id)14>).
                                              super_Expression.type.id,Or);
            *(BinaryOp *)(pEVar7 + 1) = BVar5;
            (pEVar7->type).id =
                 (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                 id;
            pEVar7[1].type.id = (uintptr_t)pCVar2;
            local_58 = (element_type *)local_38;
            goto LAB_009db9cd;
          }
        }
      }
    }
    curr_00 = (Binary *)0x0;
  }
  return (Expression *)curr_00;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }